

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinput.cc
# Opt level: O3

int ImageInput::open(char *__file,int __oflag,...)

{
  _Rb_tree_node_base *__args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  size_type sVar4;
  int iVar5;
  stringstream *this;
  iterator iVar6;
  ImageInput *pIVar7;
  int *piVar8;
  char *pcVar9;
  __normal_iterator<ImageInput_*(**)(),_std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>_>
  _Var10;
  _Rb_tree_node_base *p_Var11;
  runtime_error *prVar12;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RCX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *__file_00;
  pointer __old_p;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *in;
  string specificError;
  Creator createFunction;
  vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_> formatsTried;
  string format;
  string sn;
  ifstream ifs;
  stringstream *local_3d8;
  string_type local_3d0;
  _func_ImageInput_ptr *local_3b0;
  void *local_3a8;
  iterator iStack_3a0;
  _func_ImageInput_ptr **local_398;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_388;
  size_type local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  undefined1 local_368 [40];
  undefined8 local_340;
  undefined1 local_338;
  undefined7 uStack_337;
  void *local_328;
  undefined8 uStack_320;
  long local_318;
  void *pvStack_310;
  undefined8 local_308;
  undefined7 uStack_300;
  undefined1 uStack_2f9;
  undefined7 uStack_2f8;
  undefined8 uStack_2f1;
  long *local_2e8 [2];
  long local_2d8 [2];
  undefined1 *local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  _Any_data local_2a8;
  code *local_298;
  _Any_data local_288;
  code *local_278;
  string local_268;
  undefined1 *local_248;
  undefined8 uStack_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_390 = in_RCX;
  if ((Imageio::inputFormats_abi_cxx11_._40_8_ == 0) &&
     (Imageio::catalogBuiltinPlugins(), Imageio::inputFormats_abi_cxx11_._40_8_ == 0)) {
    __assert_fail("!Imageio::inputFormats.empty() && \"No image input plugins compiled in.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/imageinput.cc"
                  ,0x25,
                  "static std::unique_ptr<ImageInput> ImageInput::open(const std::string &, const ImageSpec *, WarningCallbackFunction)"
                 );
  }
  std::ifstream::ifstream(local_238);
  local_3d8 = (stringstream *)0x0;
  local_3b0 = (_func_ImageInput_ptr *)0x0;
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"stdin","");
  iVar5 = std::__cxx11::string::compare((char *)___oflag);
  if (iVar5 == 0) {
    std::istream::seekg(&std::cin,0,0);
    __file_00 = (string *)local_2e8;
    if (((byte)ferror[*(long *)(std::cin + -0x18)] & 5) != 0) {
      this = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(this);
      if (local_3d8 != (stringstream *)0x0) {
        lVar2 = *(long *)local_3d8;
        local_3d8 = this;
        (**(code **)(lVar2 + 8))();
        this = local_3d8;
      }
      local_3d8 = this;
      std::ostream::operator<<
                (local_3d8 + 0x10,*(streambuf **)(*(long *)(std::cin + -0x18) + 0x1b56d0));
      std::istream::seekg((long)local_3d8,_S_beg);
    }
  }
  else {
    local_388 = &local_378;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_388,*(long *)___oflag,*(long *)(___oflag + 8) + *(long *)___oflag);
    paVar1 = &local_3d0.field_2;
    if (local_388 == &local_378) {
      local_3d0.field_2._8_8_ = local_378._8_8_;
      local_3d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3d0._M_dataplus._M_p = (pointer)local_388;
    }
    local_3d0.field_2._M_allocated_capacity._1_7_ = local_378._M_allocated_capacity._1_7_;
    local_3d0.field_2._M_local_buf[0] = local_378._M_local_buf[0];
    local_3d0._M_string_length = local_380;
    local_380 = 0;
    local_378._M_local_buf[0] = '\0';
    local_388 = &local_378;
    std::filesystem::__cxx11::path::path((path *)local_368,&local_3d0,auto_format);
    std::ifstream::open((char *)local_238,local_368._0_4_);
    std::filesystem::__cxx11::path::~path((path *)local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    if (local_388 != &local_378) {
      operator_delete(local_388,
                      CONCAT71(local_378._M_allocated_capacity._1_7_,local_378._M_local_buf[0]) + 1)
      ;
    }
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      local_368._0_8_ = *(undefined8 *)___oflag;
      local_368._8_5_ = (undefined5)*(undefined8 *)(___oflag + 8);
      local_368._13_3_ = (undefined3)((ulong)*(undefined8 *)(___oflag + 8) >> 0x28);
      local_368._16_5_ = SUB85(pcVar9,0);
      local_368._21_3_ = (undefined3)((ulong)pcVar9 >> 0x28);
      fmt.size_ = 0xcd;
      fmt.data_ = (char *)0x17;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_368;
      ::fmt::v10::vformat_abi_cxx11_(&local_3d0,(v10 *)"Open of \"{}\" failed. {}",fmt,args);
      std::runtime_error::runtime_error(prVar12,(string *)&local_3d0);
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::rfind((char)___oflag,0x2e);
    std::__cxx11::string::substr((ulong)&local_3d0,(ulong)___oflag);
    local_368._0_8_ = local_368 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_368,local_3d0._M_dataplus._M_p,
               local_3d0._M_dataplus._M_p + local_3d0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    Imageio::string::tolower(&local_268,(int)local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268.super_string._M_dataplus._M_p != &local_268.super_string.field_2) {
      operator_delete(local_268.super_string._M_dataplus._M_p,
                      local_268.super_string.field_2._M_allocated_capacity + 1);
    }
    if ((CONCAT35(local_368._13_3_,local_368._8_5_) != 0) &&
       (iVar6 = Imageio::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                        *)Imageio::inputFormats_abi_cxx11_,(key_type *)local_368),
       iVar6._M_node != (_Base_ptr)(Imageio::inputFormats_abi_cxx11_ + 8))) {
      local_3b0 = *(_func_ImageInput_ptr **)(iVar6._M_node + 2);
    }
    __file_00 = ___oflag;
    if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
      operator_delete((void *)local_368._0_8_,CONCAT35(local_368._21_3_,local_368._16_5_) + 1);
    }
  }
  local_3a8 = (void *)0x0;
  iStack_3a0._M_current = (_func_ImageInput_ptr **)0x0;
  local_398 = (_func_ImageInput_ptr **)0x0;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0._M_string_length = 0;
  local_3d0.field_2._M_allocated_capacity =
       local_3d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  __file[0] = '\0';
  __file[1] = '\0';
  __file[2] = '\0';
  __file[3] = '\0';
  __file[4] = '\0';
  __file[5] = '\0';
  __file[6] = '\0';
  __file[7] = '\0';
  if (local_3b0 == (_func_ImageInput_ptr *)0x0) {
    p_Var11 = (_Rb_tree_node_base *)Imageio::inputFormats_abi_cxx11_._24_8_;
    if (Imageio::inputFormats_abi_cxx11_._24_8_ != 0x1b4eb0) {
      do {
        __args = p_Var11 + 2;
        _Var10 = std::
                 __find_if<__gnu_cxx::__normal_iterator<ImageInput*(**)(),std::vector<ImageInput*(*)(),std::allocator<ImageInput*(*)()>>>,__gnu_cxx::__ops::_Iter_equals_val<ImageInput*(*const)()>>
                           (local_3a8,iStack_3a0._M_current,__args);
        if (_Var10._M_current == iStack_3a0._M_current) {
          if (_Var10._M_current == local_398) {
            std::vector<ImageInput*(*)(),std::allocator<ImageInput*(*)()>>::
            _M_realloc_insert<ImageInput*(*const&)()>
                      ((vector<ImageInput*(*)(),std::allocator<ImageInput*(*)()>> *)&local_3a8,
                       iStack_3a0,(_func_ImageInput_ptr **)__args);
            local_3b0 = *(_func_ImageInput_ptr **)__args;
          }
          else {
            local_3b0 = *(_func_ImageInput_ptr **)__args;
            *iStack_3a0._M_current = local_3b0;
            iStack_3a0._M_current = iStack_3a0._M_current + 1;
          }
          pIVar7 = (*local_3b0)();
          plVar3 = *(long **)__file;
          *(ImageInput **)__file = pIVar7;
          if (plVar3 != (long *)0x0) {
            (**(code **)(*plVar3 + 8))();
          }
          Imageio::std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_288,local_390);
          Imageio::std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator=(&pIVar7->sendWarning,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_288);
          if (local_278 != (code *)0x0) {
            (*local_278)(&local_288,&local_288,__destroy_functor);
          }
          local_368._0_8_ = (pointer)0x0;
          local_368._8_5_ = 0;
          local_368._13_3_ = 0;
          local_368._16_5_ = 0;
          local_368._24_4_ = 0xbf800000;
          local_368._32_8_ = &local_338;
          local_340 = 0;
          local_338 = 0;
          uStack_2f8 = 0;
          uStack_2f1 = 0;
          local_308 = 0;
          uStack_300 = 0;
          uStack_2f9 = 0;
          local_318 = 0;
          pvStack_310 = (void *)0x0;
          local_328 = (void *)0x0;
          uStack_320 = 0;
          open(pIVar7,(char *)__file_00,(int)local_238,&local_3d8,local_368);
          if (pvStack_310 != (void *)0x0) {
            operator_delete(pvStack_310,CONCAT17(uStack_2f9,uStack_300) - (long)pvStack_310);
          }
          if (local_328 != (void *)0x0) {
            operator_delete(local_328,local_318 - (long)local_328);
          }
          if ((undefined1 *)local_368._32_8_ == &local_338) goto LAB_0012f991;
          goto LAB_0012f981;
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while (p_Var11 != (_Rb_tree_node_base *)(Imageio::inputFormats_abi_cxx11_ + 8));
    }
    sVar4 = local_3d0._M_string_length;
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    if (sVar4 != 0) {
      std::runtime_error::runtime_error(prVar12,(string *)&local_3d0);
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar5 = std::__cxx11::string::compare((char *)___oflag);
    local_2c8 = local_2b8;
    if (iVar5 == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"the data on stdin","");
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c8,*(long *)___oflag,*(long *)(___oflag + 8) + *(long *)___oflag)
      ;
    }
    local_248 = local_2c8;
    uStack_240 = uStack_2c0;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x5d;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_248;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_368,
               (v10 *)
               "No image plugin recognized the format of \"{}\". Is it a file format that we don\'t know about?\n"
               ,fmt_00,args_00);
    std::runtime_error::runtime_error(prVar12,(string *)local_368);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<ImageInput*(*)(),std::allocator<ImageInput*(*)()>>::
  _M_realloc_insert<ImageInput*(*const&)()>
            ((vector<ImageInput*(*)(),std::allocator<ImageInput*(*)()>> *)&local_3a8,(iterator)0x0,
             &local_3b0);
  pIVar7 = (*local_3b0)();
  *(ImageInput **)__file = pIVar7;
  Imageio::std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_2a8,local_390);
  Imageio::std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator=(&pIVar7->sendWarning,
              (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)&local_2a8);
  if (local_298 != (code *)0x0) {
    (*local_298)(&local_2a8,&local_2a8,__destroy_functor);
  }
  local_368._0_8_ = (pointer)0x0;
  local_368._8_5_ = 0;
  local_368._13_3_ = 0;
  local_368._16_5_ = 0;
  local_368._24_4_ = 0xbf800000;
  local_340 = 0;
  local_338 = 0;
  local_328 = (void *)0x0;
  uStack_320 = 0;
  local_318 = 0;
  pvStack_310 = (void *)0x0;
  local_308 = 0;
  uStack_300 = 0;
  uStack_2f9 = 0;
  uStack_2f8 = 0;
  uStack_2f1 = 0;
  local_368._32_8_ = &local_338;
  open(pIVar7,(char *)__file_00,(int)local_238,&local_3d8,local_368);
  if (pvStack_310 != (void *)0x0) {
    operator_delete(pvStack_310,CONCAT17(uStack_2f9,uStack_300) - (long)pvStack_310);
  }
  if (local_328 != (void *)0x0) {
    operator_delete(local_328,local_318 - (long)local_328);
  }
  if ((undefined1 *)local_368._32_8_ != &local_338) {
LAB_0012f981:
    operator_delete((void *)local_368._32_8_,CONCAT71(uStack_337,local_338) + 1);
  }
LAB_0012f991:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if (local_3a8 != (void *)0x0) {
    operator_delete(local_3a8,(long)local_398 - (long)local_3a8);
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0],local_2d8[0] + 1);
  }
  if (local_3d8 != (stringstream *)0x0) {
    (**(code **)(*(long *)local_3d8 + 8))();
  }
  std::ifstream::~ifstream(local_238);
  return (int)__file;
}

Assistant:

std::unique_ptr<ImageInput>
ImageInput::open(const std::string& filename,
                 const ImageSpec* /*config*/,
                 WarningCallbackFunction wcb)
                 //Filesystem::IOProxy* ioproxy, string_view plugin_searchpath)
{
    // Populate inputFormats.
    if (Imageio::inputFormats.empty()) {
        Imageio::catalogBuiltinPlugins();
        assert(!Imageio::inputFormats.empty() && "No image input plugins compiled in.");
    }

    std::ifstream ifs;
    std::unique_ptr<std::stringstream> buffer;
    ImageInput::Creator createFunction = nullptr;
    const std::string* fn;
    const std::string sn("stdin");
    bool doBuffer = true;

    if (filename.compare("-")) {
        // Regular file.
        // Check file exists, before looking for a suitable plugin.
        // MS's STL has `open` overloads that accept wchar_t to handle
        // Window's Unicode file names.
        ifs.open(std::filesystem::path(DecodeUTF8Path(filename)), std::ios::binary | std::ios::in);
        if (ifs.fail()) {
            throw std::runtime_error(
                fmt::format("Open of \"{}\" failed. {}",
                            filename, strerror(errno))
            );
        }

        // Extract the file extension from the filename (without the leading dot)
        Imageio::string format = filename.substr(filename.find_last_of('.')+1);
        format.tolower();

        // Look for a plugin for that extension.
        if (!format.empty()) {
            // First try the plug-in that matches the extension
            Imageio::InputPluginMap::const_iterator found
                       = Imageio::inputFormats.find(format);
            if (found != Imageio::inputFormats.end()) {
                createFunction = found->second;
            }
        }
        fn = &filename;
    } else {
        // cin (stdin)
#if defined(_WIN32)
        // Set "stdin" to have binary mode. There is no way to this via cin.
        (void)_setmode( _fileno( stdin ), _O_BINARY );
        // Windows shells set the FILE_SYNCHRONOUS_IO_NONALERT option when
        // creating pipes. Cygwin since 3.4.x does the same thing, a change
        // which affects anything dependent on it, e.g. Git for Windows
        // (since 2.41.0) and MSYS2. When this option is set, cin.seekg(0)
        // erroneously returns success. Always buffer.
        doBuffer = true;
#else
        // Can we seek in this cin?
        std::cin.seekg(0);
        doBuffer = std::cin.fail();
#endif
        if (doBuffer) {
            // Can't seek. Buffer stdin. This is a potentially large buffer.
            // Must avoid copy. If use stack variable for ss, it's streambuf
            // will also be on the stack and lost after this function exits
            // even with std::move.
            buffer =
                std::unique_ptr<std::stringstream>(new std::stringstream);
            *buffer << std::cin.rdbuf();
            buffer->seekg(0, std::ios::beg);
        }
        fn = &sn;
    }

    // Remember which formats we've already tried, so we don't double dip.
    std::vector<ImageInput::Creator> formatsTried;
    std::string specificError;
    std::unique_ptr<ImageInput> in;

    if (createFunction) {
        formatsTried.push_back(createFunction);
        // Try our guess.
        try {
            in = std::unique_ptr<ImageInput>(createFunction());
            in->connectCallback(wcb);
            ImageSpec tmpspec;
            in->open(*fn, ifs, buffer, tmpspec);
            return in;
        } catch (const std::runtime_error& e) {
            // Oops, it failed.  Apparently, this file can't be
            // opened with this II.
            if (in) {
                specificError = e.what();
                in.reset();
            }
        }
    }

    // A plugin designated for the requested extension either couldn't be
    // found or was unable to open the file or there is no requested extension
    // due to stdin. Try every plugin and see if one will open the file.
    for (auto&& plugin : Imageio::inputFormats) {
        // If we already tried this create function, don't do it again
        if (std::find(formatsTried.begin(), formatsTried.end(), plugin.second)
            != formatsTried.end()) {
            continue;
        }
        formatsTried.push_back(plugin.second);  // remember
        createFunction = plugin.second;
        try {
            in = std::unique_ptr<ImageInput>(createFunction());
            in->connectCallback(wcb);
            ImageSpec tmpspec;
            in->open(*fn, ifs, buffer, tmpspec);
            return in;
        } catch (...) {
            if (in.get()) in.reset();
            continue;
        }
    }

    if (!specificError.empty()) {
        // Pass along any specific error message we got from our
        // best guess of the format.
        throw std::runtime_error(specificError);
    } else {
        throw std::runtime_error(
            fmt::format(
                "No image plugin recognized the format of \"{}\". "
                "Is it a file format that we don't know about?\n",
                filename.compare("-") ? filename : "the data on stdin")
            );
    }
}